

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-link.cpp
# Opt level: O0

void __thiscall
rtosc::ThreadLink::ThreadLink(ThreadLink *this,size_t max_message_length,size_t max_messages)

{
  void *pvVar1;
  long in_RDX;
  __atomic_base<long> *in_RSI;
  ulong *in_RDI;
  
  *in_RDI = (ulong)in_RSI;
  in_RDI[1] = *in_RDI * in_RDX;
  pvVar1 = operator_new__(*in_RDI);
  in_RDI[2] = (ulong)pvVar1;
  pvVar1 = operator_new__(*in_RDI);
  in_RDI[3] = (ulong)pvVar1;
  pvVar1 = operator_new(0x28);
  in_RDI[4] = (ulong)pvVar1;
  pvVar1 = operator_new__(in_RDI[1]);
  *(void **)in_RDI[4] = pvVar1;
  *(ulong *)(in_RDI[4] + 0x20) = in_RDI[1];
  std::__atomic_base<long>::operator=(in_RSI,in_RDX);
  std::__atomic_base<long>::operator=(in_RSI,in_RDX);
  std::__atomic_base<long>::operator=(in_RSI,in_RDX);
  memset((void *)in_RDI[2],0,*in_RDI);
  memset((void *)in_RDI[3],0,*in_RDI);
  return;
}

Assistant:

ThreadLink::ThreadLink(size_t max_message_length, size_t max_messages)
    :MaxMsg(max_message_length),
    BufferSize(MaxMsg*max_messages),
    write_buffer(new char[MaxMsg]),
    read_buffer(new char[MaxMsg]),
    ring(new ringbuffer_t)
{
    ring->buffer         = new char[BufferSize];
    ring->size           = BufferSize;
    ring->read           = 0;
    ring->read_lookahead = 0;
    ring->write          = 0;
    memset(write_buffer, 0, MaxMsg);
    memset(read_buffer, 0, MaxMsg);
}